

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_quat2mat(double *R,double *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double q31;
  double q23;
  double q12;
  double q30;
  double q20;
  double q10;
  double q33;
  double q22;
  double q11;
  double *q_local;
  double *R_local;
  
  dVar1 = q[1] * 2.0 * q[1];
  dVar2 = q[2] * 2.0 * q[2];
  dVar3 = q[3] * 2.0 * q[3];
  dVar4 = q[1] * 2.0 * *q;
  dVar5 = q[2] * 2.0 * *q;
  dVar6 = q[3] * 2.0 * *q;
  dVar7 = q[1] * 2.0 * q[2];
  dVar8 = q[2] * 2.0 * q[3];
  dVar9 = q[3] * 2.0 * q[1];
  *R = (1.0 - dVar2) - dVar3;
  R[1] = dVar7 + dVar6;
  R[2] = dVar9 - dVar5;
  R[3] = dVar7 - dVar6;
  R[4] = (1.0 - dVar3) - dVar1;
  R[5] = dVar8 + dVar4;
  R[6] = dVar9 + dVar5;
  R[7] = dVar8 - dVar4;
  R[8] = (1.0 - dVar1) - dVar2;
  return;
}

Assistant:

void fsnav_linal_quat2mat(double* R, double* q)
{
	double q11, q22, q33, q10, q20, q30, q12, q23, q31;

	q11 = 2*q[1]*q[1];
	q22 = 2*q[2]*q[2];
	q33 = 2*q[3]*q[3];

	q10 = 2*q[1]*q[0];
	q20 = 2*q[2]*q[0];
	q30 = 2*q[3]*q[0];

	q12 = 2*q[1]*q[2];
	q23 = 2*q[2]*q[3];
	q31 = 2*q[3]*q[1];

	R[0] = 1 - q22 - q33; R[1] =     q12 + q30; R[2] =     q31 - q20;
	R[3] =     q12 - q30; R[4] = 1 - q33 - q11; R[5] =     q23 + q10;
	R[6] =     q31 + q20; R[7] =     q23 - q10; R[8] = 1 - q11 - q22;
}